

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  ulong uVar7;
  ImRect IVar8;
  
  pIVar5 = GImGui;
  if (((GImGui->ActiveId != 0) || (GImGui->HoveredId != 0)) ||
     ((pIVar6 = GImGui->NavWindow, pIVar6 != (ImGuiWindow *)0x0 && (pIVar6->Appearing != false)))) {
    return;
  }
  if ((GImGui->IO).MouseClicked[0] == true) {
    if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
      if ((pIVar6 != (ImGuiWindow *)0x0) &&
         (pIVar6 = GetTopMostPopupModal(), pIVar6 == (ImGuiWindow *)0x0)) {
        FocusWindow((ImGuiWindow *)0x0);
      }
    }
    else {
      StartMouseMovingWindow(GImGui->HoveredWindow);
      if (((pIVar5->IO).ConfigWindowsMoveFromTitleBarOnly == true) &&
         ((pIVar5->HoveredRootWindow->Flags & 1) == 0)) {
        IVar8 = ImGuiWindow::TitleBarRect(pIVar5->HoveredRootWindow);
        fVar1 = (pIVar5->IO).MouseClickedPos[0].x;
        if ((fVar1 < IVar8.Min.x) ||
           (((fVar2 = (pIVar5->IO).MouseClickedPos[0].y, fVar2 < IVar8.Min.y ||
             (IVar8.Max.x <= fVar1)) || (IVar8.Max.y <= fVar2)))) {
          pIVar5->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
    }
  }
  if ((pIVar5->IO).MouseClicked[1] != true) {
    return;
  }
  pIVar6 = GetTopMostPopupModal();
  uVar7 = (ulong)(pIVar5->Windows).Size;
  if ((long)uVar7 < 1 || pIVar6 == (ImGuiWindow *)0x0) {
    if (pIVar6 != (ImGuiWindow *)0x0) goto LAB_001d6faa;
  }
  else {
    bVar4 = false;
    while (pIVar3 = (pIVar5->Windows).Data[uVar7 - 1], pIVar3 != pIVar6) {
      if (pIVar3 == pIVar5->HoveredWindow) {
        bVar4 = true;
      }
      if ((uVar7 < 2) || (uVar7 = uVar7 - 1, bVar4)) break;
    }
    if (!bVar4) goto LAB_001d6faa;
  }
  pIVar6 = pIVar5->HoveredWindow;
LAB_001d6faa:
  ClosePopupsOverWindow(pIVar6,true);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    // Initiate moving window
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}